

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* __thiscall
mesh::createmat(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *__return_storage_ptr__,mesh *this,int m,int r,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *mcurrent,
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *res,int c)

{
  float fVar1;
  value_type vVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  value_type_conflict2 local_84;
  reference local_80;
  vector<float,_std::allocator<float>_> *row;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *__range1;
  allocator<std::vector<float,_std::allocator<float>_>_> local_4a;
  undefined1 local_49;
  int local_48;
  int local_44;
  int j;
  int i;
  int jj;
  int ii;
  int kk;
  int k;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *res_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *mcurrent_local;
  int r_local;
  int m_local;
  mesh *this_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *a;
  
  local_49 = 0;
  _kk = res;
  res_local = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)mcurrent;
  mcurrent_local._0_4_ = r;
  mcurrent_local._4_4_ = m;
  _r_local = this;
  this_local = (mesh *)__return_storage_ptr__;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator(&local_4a);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__,(long)m,&local_4a);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator(&local_4a);
  __end1 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::begin(__return_storage_ptr__);
  row = (vector<float,_std::allocator<float>_> *)
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::end(__return_storage_ptr__);
  while (bVar5 = __gnu_cxx::
                 operator==<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                           (&__end1,(__normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                                     *)&row), ((bVar5 ^ 0xffU) & 1) != 0) {
    local_80 = __gnu_cxx::
               __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator*(&__end1);
    local_84 = 0.0;
    std::vector<float,_std::allocator<float>_>::resize
              (local_80,(long)mcurrent_local._4_4_,&local_84);
    __gnu_cxx::
    __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
    ::operator++(&__end1);
  }
  for (ii = 1; ii < c + -1; ii = ii + (int)mcurrent_local + 1) {
    for (local_44 = 0; local_44 < (int)mcurrent_local; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < (int)mcurrent_local; local_48 = local_48 + 1) {
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)res_local,(long)local_44);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(local_48 + ii));
        if (*pvVar7 == 1) {
          pvVar8 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](_kk,(long)local_44);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)local_48);
          if ((*pvVar9 != 0.0) || (NAN(*pvVar9))) {
            pvVar8 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[](_kk,(long)local_44);
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)local_48);
            fVar1 = *pvVar9;
            pvVar8 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[](__return_storage_ptr__,(long)(ii / (int)mcurrent_local));
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                               (pvVar8,(long)(ii / (int)mcurrent_local));
            *pvVar9 = fVar1 + *pvVar9;
          }
        }
      }
    }
  }
  for (local_44 = 0; local_48 = local_44, local_44 < mcurrent_local._4_4_ + -1;
      local_44 = local_44 + 1) {
    while (local_48 = local_48 + 1, local_48 < mcurrent_local._4_4_) {
      ii = ((int)mcurrent_local + 1) * local_44 + 1;
      jj = ((int)mcurrent_local + 1) * local_48 + 1;
      for (i = 0; i < (int)mcurrent_local; i = i + 1) {
        for (j = i; j < (int)mcurrent_local; j = j + 1) {
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)res_local,(long)i);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(j + ii));
          if (*pvVar7 != 0) {
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)res_local,(long)i);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(j + jj));
            if (*pvVar7 != 0) {
              pvVar6 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)res_local,(long)i);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(j + ii));
              iVar3 = *pvVar7;
              pvVar6 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)res_local,(long)i);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(j + jj));
              iVar4 = *pvVar7;
              pvVar8 = std::
                       vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ::operator[](_kk,(long)i);
              pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)j);
              fVar1 = *pvVar9;
              pvVar8 = std::
                       vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ::operator[](__return_storage_ptr__,(long)local_44);
              pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)local_48)
              ;
              *pvVar9 = (float)(iVar3 * iVar4) * fVar1 + *pvVar9;
            }
          }
        }
      }
    }
  }
  for (local_44 = 0; local_44 < mcurrent_local._4_4_; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
      pvVar8 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](__return_storage_ptr__,(long)local_48);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)local_44);
      vVar2 = *pvVar9;
      pvVar8 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](__return_storage_ptr__,(long)local_44);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)local_48);
      *pvVar9 = vVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<float>> createmat(int m, int r, std::vector<std::vector<int>> &mcurrent, std::vector<std::vector<float>> &res, int c)
    {

        int  k, kk, ii, jj, i, j;
        std::vector<std::vector<float>> a(m);
        for (auto &row : a)
        {
            row.resize(m, 0);
        }

        //element on the diagonal
        for(k=1; k<c-1; k=k+r+1)
        {
            for(i=0; i < r; i++)
            {
                for(j=0; j < r; j++)
                {
                    if(mcurrent[i][j+k]==1 && res[i][j]!=0)
                    {
                        a[k/r][k/r] += res[i][j];
                    }
                }
            }
        }

        //element off the diagonal
        for(i=0; i < m-1; i++) {
            for (j = i + 1; j < m; j++) {
                k = 1 + (r + 1) * i;
                kk = 1 + (r + 1) * j;
                for (ii = 0; ii < r; ii++) {
                    for (jj = ii; jj < r; jj++) {
                        if (mcurrent[ii][jj + k] != 0 && mcurrent[ii][jj + kk] != 0) {
                            a[i][j] += (mcurrent[ii][jj + k] * mcurrent[ii][jj + kk]) * res[ii][jj];
                        }
                    }
                }
            }
        }

            for(i = 0; i < m; i++)
            {
                for(j = 0; j < i; j++)
                {
                    a[i][j] = a[j][i];
                }
            }
             return a;
    }